

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

void WriteBinaryDump(aiScene *scene,FILE *_out,char *src,char *cmd,bool _shortened,bool compressed,
                    ImportData *param_7)

{
  FILE *__stream;
  char *pcVar1;
  long lVar2;
  undefined1 local_258 [8];
  char buff_2 [64];
  char buff_1 [128];
  char buff [256];
  ushort local_8c;
  ushort local_8a;
  uint local_88;
  uint local_84 [3];
  tm *local_78;
  tm *p;
  tm now;
  time_t tt;
  bool compressed_local;
  bool _shortened_local;
  char *cmd_local;
  char *src_local;
  FILE *_out_local;
  aiScene *scene_local;
  
  out = _out;
  shortened = _shortened;
  now.tm_zone = (char *)time((time_t *)0x0);
  local_78 = gmtime_r((time_t *)&now.tm_zone,(tm *)&p);
  __stream = out;
  if (local_78 == (tm *)0x0) {
    __assert_fail("nullptr != p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                  ,0x2b3,
                  "void WriteBinaryDump(const aiScene *, FILE *, const char *, const char *, bool, bool, ImportData &)"
                 );
  }
  pcVar1 = asctime(local_78);
  fprintf((FILE *)__stream,"ASSIMP.binary-dump.%s",pcVar1);
  local_84[2] = 1;
  Write<unsigned_int>(local_84 + 2);
  local_84[1] = 0;
  Write<unsigned_int>(local_84 + 1);
  local_84[0] = aiGetVersionRevision();
  Write<unsigned_int>(local_84);
  local_88 = aiGetCompileFlags();
  Write<unsigned_int>(&local_88);
  local_8a = (ushort)(shortened & 1);
  Write<unsigned_short>(&local_8a);
  local_8c = (ushort)compressed;
  Write<unsigned_short>(&local_8c);
  memset(buff_1 + 0x78,0,0x100);
  strncpy(buff_1 + 0x78,src,0x100);
  fwrite(buff_1 + 0x78,0x100,1,(FILE *)out);
  memset(buff_2 + 0x38,0,0x80);
  strncpy(buff_2 + 0x38,cmd,0x80);
  buff_1[0x77] = '\0';
  fwrite(buff_2 + 0x38,0x80,1,(FILE *)out);
  memset(local_258,0xcd,0x40);
  fwrite(local_258,0x40,1,(FILE *)out);
  lVar2 = ftell((FILE *)out);
  if (lVar2 == 0x200) {
    WriteBinaryScene(scene);
    return;
  }
  __assert_fail("ftell(out)==512",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                ,0x2d8,
                "void WriteBinaryDump(const aiScene *, FILE *, const char *, const char *, bool, bool, ImportData &)"
               );
}

Assistant:

void WriteBinaryDump(const aiScene* scene, FILE* _out, const char* src, const char* cmd, 
	bool _shortened, bool compressed, ImportData& /*imp*/)
{
	out = _out;
	shortened = _shortened;

	time_t tt = time(NULL);
#if _WIN32
    tm* p = gmtime(&tt);
#else
    struct tm now;
    tm* p = gmtime_r(&tt, &now);
#endif
    ai_assert(nullptr != p);

	// header
	fprintf(out,"ASSIMP.binary-dump.%s",asctime(p));
	// == 44 bytes

	Write<unsigned int>(ASSBIN_VERSION_MAJOR);
	Write<unsigned int>(ASSBIN_VERSION_MINOR);
	Write<unsigned int>(aiGetVersionRevision());
	Write<unsigned int>(aiGetCompileFlags());
	Write<uint16_t>(shortened);
	Write<uint16_t>(compressed);
	// ==  20 bytes

	{
		char buff[256] = { 0 };
		strncpy(buff,src,256);
		buff[255] = 0;
		fwrite(buff,256,1,out);
	}

	{
		char buff[128] = { 0 };
		strncpy(buff,cmd,128);
		buff[127] = 0;
		fwrite(buff,128,1,out);
	}

	// leave 64 bytes free for future extensions
	{
		char buff[64];
		memset(buff,0xcd,64);
		fwrite(buff,64,1,out);
	}
	// == 435 bytes

	// ==== total header size: 512 bytes
	ai_assert(ftell(out)==ASSBIN_HEADER_LENGTH);

	// Up to here the data is uncompressed. For compressed files, the rest
	// is compressed using standard DEFLATE from zlib.
	WriteBinaryScene(scene);
}